

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int xmlParse3986PathAbEmpty(xmlURIPtr uri,char **str)

{
  xmlChar *pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  char *cur;
  xmlChar *local_30;
  
  local_30 = (xmlChar *)*str;
  do {
    pxVar1 = local_30;
    if (*local_30 != '/') {
      if (uri != (xmlURIPtr)0x0) {
        if (uri->path != (char *)0x0) {
          (*xmlFree)(uri->path);
        }
        pxVar3 = (xmlChar *)*str;
        if (pxVar3 == pxVar1) {
          pxVar3 = (xmlChar *)0x0;
        }
        else {
          iVar2 = (int)pxVar1 - (int)pxVar3;
          if ((uri->cleanup & 2) == 0) {
            pxVar3 = (xmlChar *)xmlURIUnescapeString((char *)pxVar3,iVar2,(char *)0x0);
          }
          else {
            pxVar3 = xmlStrndup(pxVar3,iVar2);
          }
        }
        uri->path = (char *)pxVar3;
      }
      *str = (char *)pxVar1;
      return 0;
    }
    local_30 = local_30 + 1;
    iVar2 = xmlParse3986Segment((char **)&local_30,'\0',1);
  } while (iVar2 == 0);
  return 1;
}

Assistant:

static int
xmlParse3986PathAbEmpty(xmlURIPtr uri, const char **str)
{
    const char *cur;
    int ret;

    cur = *str;

    while (*cur == '/') {
        cur++;
	ret = xmlParse3986Segment(&cur, 0, 1);
	if (ret != 0) return(ret);
    }
    if (uri != NULL) {
	if (uri->path != NULL) xmlFree(uri->path);
        if (*str != cur) {
            if (uri->cleanup & 2)
                uri->path = STRNDUP(*str, cur - *str);
            else
                uri->path = xmlURIUnescapeString(*str, cur - *str, NULL);
        } else {
            uri->path = NULL;
        }
    }
    *str = cur;
    return (0);
}